

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_hello_retry_request
              (ptls_t *tls,ptls_message_emitter_t *emitter,st_ptls_server_hello_t *sh,
              ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  uint16_t uVar2;
  ptls_key_exchange_context_t *ppVar3;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar4;
  byte bVar5;
  int iVar6;
  ptls_key_exchange_algorithm_t **pppVar7;
  
  ppVar3 = (tls->field_19).client.key_share_ctx;
  if (ppVar3 != (ptls_key_exchange_context_t *)0x0) {
    pppVar1 = &(tls->field_19).client.key_share_ctx;
    (*ppVar3->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
    *pppVar1 = (ptls_key_exchange_context_t *)0x0;
  }
  bVar5 = (tls->field_19).server.pending_traffic_secret[0x38];
  if ((bVar5 & 2) != 0) {
    if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
      __ptr = (tls->traffic_protection).enc.aead;
      if (__ptr == (st_ptls_aead_context_t *)0x0) {
        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0xabb,
                      "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      (*__ptr->dispose_crypto)(__ptr);
      free(__ptr);
      (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
      bVar5 = (tls->field_19).server.pending_traffic_secret[0x38];
    }
    (tls->field_19).server.pending_traffic_secret[0x38] = bVar5 & 0xfd;
  }
  uVar2 = (sh->field_3).retry_request.selected_group;
  if (uVar2 == 0xffff) {
    if (tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00126be2:
      iVar6 = send_client_hello(tls,emitter,(ptls_handshake_properties_t *)message.base,
                                &(sh->field_3).retry_request.cookie);
      return iVar6;
    }
  }
  else {
    pppVar7 = tls->ctx->key_exchanges;
    ppVar4 = *pppVar7;
    while (ppVar4 != (ptls_key_exchange_algorithm_t *)0x0) {
      pppVar7 = pppVar7 + 1;
      if (ppVar4->id == uVar2) {
        tls->key_share = ppVar4;
        goto LAB_00126be2;
      }
      ppVar4 = *pppVar7;
    }
  }
  return 0x2f;
}

Assistant:

static int handle_hello_retry_request(ptls_t *tls, ptls_message_emitter_t *emitter, struct st_ptls_server_hello_t *sh,
                                      ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    int ret;

    if (tls->client.key_share_ctx != NULL) {
        tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        tls->client.key_share_ctx = NULL;
    }
    if (tls->client.using_early_data) {
        /* release traffic encryption key so that 2nd CH goes out in cleartext, but keep the epoch at 1 since we've already
         * called derive-secret */
        if (tls->ctx->update_traffic_key == NULL) {
            assert(tls->traffic_protection.enc.aead != NULL);
            ptls_aead_free(tls->traffic_protection.enc.aead);
            tls->traffic_protection.enc.aead = NULL;
        }
        tls->client.using_early_data = 0;
    }

    if (sh->retry_request.selected_group != UINT16_MAX) {
        /* we offer the first key_exchanges[0] as KEY_SHARE unless client.negotiate_before_key_exchange is set */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == sh->retry_request.selected_group)
                break;
        if (*cand == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        tls->key_share = *cand;
    } else if (tls->key_share != NULL) {
        /* retain the key-share using in first CH, if server does not specify one */
    } else {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    ret = send_client_hello(tls, emitter, properties, &sh->retry_request.cookie);

Exit:
    return ret;
}